

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

void __thiscall QWidgetLineControl::selectWordAtPos(QWidgetLineControl *this,int cursor)

{
  int iVar1;
  CursorMode pos;
  QTextLayout *pQVar2;
  CursorMode in_ESI;
  QWidgetLineControl *in_RDI;
  int end;
  int c;
  int next;
  QString *in_stack_ffffffffffffffc8;
  undefined1 local_29;
  undefined4 in_stack_ffffffffffffffe0;
  CursorMode CVar3;
  undefined4 local_18;
  undefined4 local_10;
  
  local_10 = in_ESI + SkipWords;
  CVar3 = local_10;
  iVar1 = QWidgetLineControl::end((QWidgetLineControl *)0x5de0f3);
  if (iVar1 < (int)CVar3) {
    local_10 = in_ESI;
  }
  pQVar2 = textLayout(in_RDI);
  pos = QTextLayout::previousCursorPosition((int)pQVar2,local_10);
  moveCursor((QWidgetLineControl *)CONCAT44(CVar3,in_stack_ffffffffffffffe0),pos,
             SUB81((ulong)in_RDI >> 0x38,0));
  pQVar2 = textLayout(in_RDI);
  local_18 = QTextLayout::nextCursorPosition((int)pQVar2,pos);
  while( true ) {
    local_29 = false;
    if ((int)in_ESI < local_18) {
      QString::operator[](in_stack_ffffffffffffffc8,0x5de17e);
      local_29 = QChar::isSpace((QChar *)0x5de186);
    }
    if (local_29 == false) break;
    local_18 = local_18 + -1;
  }
  moveCursor((QWidgetLineControl *)CONCAT44(CVar3,in_stack_ffffffffffffffe0),pos,
             SUB81((ulong)in_RDI >> 0x38,0));
  return;
}

Assistant:

void QWidgetLineControl::selectWordAtPos(int cursor)
{
    int next = cursor + 1;
    if (next > end())
        --next;
    int c = textLayout()->previousCursorPosition(next, QTextLayout::SkipWords);
    moveCursor(c, false);
    // ## text layout should support end of words.
    int end = textLayout()->nextCursorPosition(c, QTextLayout::SkipWords);
    while (end > cursor && m_text[end-1].isSpace())
        --end;
    moveCursor(end, true);
}